

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int luv_os_tmpdir(lua_State *L)

{
  int status;
  char local_2028 [4];
  int ret;
  char tmpdir [8192];
  size_t local_20;
  size_t size;
  lua_State *L_local;
  
  local_20 = 0x2000;
  size = (size_t)L;
  status = uv_os_tmpdir(local_2028,&local_20);
  if (status < 0) {
    L_local._4_4_ = luv_error((lua_State *)size,status);
  }
  else {
    lua_pushlstring((lua_State *)size,local_2028,local_20);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_os_tmpdir(lua_State* L) {
  size_t size = 2*PATH_MAX;
  char tmpdir[2*PATH_MAX];
  int ret = uv_os_tmpdir(tmpdir, &size);
  if (ret < 0) return luv_error(L, ret);
  lua_pushlstring(L, tmpdir, size);
  return 1;
}